

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
Chainstate::FlushStateToDisk
          (Chainstate *this,BlockValidationState *state,FlushStateMode mode,int nManualPruneHeight)

{
  ConstevalStringLiteral str;
  ConstevalStringLiteral str_00;
  ConstevalStringLiteral str_01;
  ConstevalStringLiteral str_02;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  strong_ordering sVar5;
  uint uVar6;
  CoinsCacheSizeState CVar7;
  int iVar8;
  reference ppVar9;
  int *piVar10;
  CCoinsViewCache *pCVar11;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  long in_FS_OFFSET;
  runtime_error *e;
  bool empty_cache;
  bool fPeriodicFlush;
  bool fPeriodicWrite;
  bool fCacheCritical;
  bool fCacheLarge;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>
  *prune_lock;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
  *__range3;
  CoinsCacheSizeState cache_state;
  bool fDoFullFlush;
  bool fFlushForPrune;
  size_t coins_mem_usage;
  bool full_flush_completed;
  time_point nNow;
  int lock_height;
  iterator __end3;
  iterator __begin3;
  int last_prune;
  size_t coins_count;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer18;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer17;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer16;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer15;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer14;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer13;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  limiting_lock;
  set<int,_std::less<int>,_std::allocator<int>_> setFilesToPrune;
  undefined4 in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff62c;
  char *in_stack_fffffffffffff630;
  CCoinsViewCache *in_stack_fffffffffffff638;
  path *in_stack_fffffffffffff640;
  undefined4 in_stack_fffffffffffff648;
  int in_stack_fffffffffffff64c;
  string *in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff658;
  undefined2 in_stack_fffffffffffff65c;
  undefined1 in_stack_fffffffffffff65e;
  undefined1 in_stack_fffffffffffff65f;
  undefined7 in_stack_fffffffffffff660;
  undefined1 in_stack_fffffffffffff667;
  allocator<char> *in_stack_fffffffffffff668;
  BlockManager *in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff67c;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *in_stack_fffffffffffff680;
  undefined7 in_stack_fffffffffffff690;
  undefined1 in_stack_fffffffffffff697;
  CCoinsViewCache *in_stack_fffffffffffff698;
  ChainstateRole in_stack_fffffffffffff6a4;
  CCoinsViewCache *in_stack_fffffffffffff6a8;
  ChainstateManager *in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c8;
  undefined4 in_stack_fffffffffffff6cc;
  undefined8 in_stack_fffffffffffff6d0;
  int iVar12;
  ConstevalFormatString<1U> in_stack_fffffffffffff6d8;
  BlockManager *in_stack_fffffffffffff6e0;
  undefined7 in_stack_fffffffffffff6e8;
  undefined1 in_stack_fffffffffffff6ef;
  undefined8 in_stack_fffffffffffff6f0;
  undefined7 in_stack_fffffffffffff6f8;
  undefined1 in_stack_fffffffffffff6ff;
  byte bVar13;
  ChainstateManager *in_stack_fffffffffffff778;
  Chainstate *in_stack_fffffffffffff780;
  int in_stack_fffffffffffff78c;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffff790;
  undefined6 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79e;
  undefined1 in_stack_fffffffffffff79f;
  bool local_854;
  bool local_853;
  Level level;
  undefined8 in_stack_fffffffffffff7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e0;
  int *in_stack_fffffffffffff7e8;
  byte local_6e1;
  allocator<char> local_6b5;
  allocator<char> local_6b4;
  allocator<char> local_6b3;
  allocator<char> local_6b2;
  allocator<char> local_6b1 [38];
  allocator<char> local_68b;
  allocator<char> local_68a [2];
  duration local_688;
  duration local_678;
  undefined8 local_660;
  allocator<char> local_655;
  allocator<char> local_654;
  undefined1 local_653 [2];
  allocator<char> local_651 [33];
  undefined4 local_630;
  int local_62c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_true>
  local_628;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_true>
  local_620;
  path local_614 [11];
  undefined1 local_440 [1080];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_614[0].super_path._M_pathname.field_2._0_4_ = in_ECX;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff668,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
             (char *)CONCAT17(in_stack_fffffffffffff65f,
                              CONCAT16(in_stack_fffffffffffff65e,
                                       CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)
                                      )),(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c
             ,SUB41((uint)in_stack_fffffffffffff648 >> 0x18,0));
  bVar3 = CanFlushToDisk((Chainstate *)in_stack_fffffffffffff638);
  if (!bVar3) {
    __assert_fail("this->CanFlushToDisk()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xadf,
                  "bool Chainstate::FlushStateToDisk(BlockValidationState &, FlushStateMode, int)");
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  bVar2 = false;
  CoinsTip((Chainstate *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
  uVar6 = CCoinsViewCache::GetCacheSize
                    ((CCoinsViewCache *)
                     CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  local_614[0].super_path._M_pathname._4_8_ = ZEXT48(uVar6);
  CoinsTip((Chainstate *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
  CCoinsViewCache::DynamicMemoryUsage(in_stack_fffffffffffff638);
  bVar3 = false;
  CVar7 = GetCoinsCacheSizeState
                    ((Chainstate *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff668,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
             (char *)CONCAT17(in_stack_fffffffffffff65f,
                              CONCAT16(in_stack_fffffffffffff65e,
                                       CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)
                                      )),(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c
             ,SUB41((uint)in_stack_fffffffffffff648 >> 0x18,0));
  bVar4 = ::node::BlockManager::IsPruneMode
                    ((BlockManager *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  level = (Level)in_stack_fffffffffffff7d0;
  if ((bVar4) &&
     (((*(byte *)(*(long *)(in_RDI + 0x48) + 0x58) & 1) != 0 ||
      (0 < (int)local_614[0].super_path._M_pathname.field_2._0_4_)))) {
    bVar4 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff640);
    level = (Level)in_stack_fffffffffffff7d0;
    if (bVar4) {
      local_614[0].super_path._M_pathname._M_dataplus._M_p._0_4_ =
           CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      local_620._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
                    *)in_stack_fffffffffffff630);
      local_628._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
                  *)in_stack_fffffffffffff630);
      while( true ) {
        bVar4 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_true>
                            *)in_stack_fffffffffffff638,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_true>
                            *)in_stack_fffffffffffff630);
        level = (Level)in_stack_fffffffffffff7d0;
        iVar12 = (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20);
        if (((bVar4 ^ 0xffU) & 1) == 0) break;
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_false,_true>
                 ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_false,_true>
                              *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        iVar12 = (ppVar9->second).height_first;
        iVar8 = std::numeric_limits<int>::max();
        if (iVar12 != iVar8) {
          local_62c = (ppVar9->second).height_first + -0xb;
          local_630 = 1;
          std::min<int>((int *)in_stack_fffffffffffff630,
                        (int *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
          piVar10 = std::max<int>((int *)in_stack_fffffffffffff630,
                                  (int *)CONCAT44(in_stack_fffffffffffff62c,
                                                  in_stack_fffffffffffff628));
          local_614[0].super_path._M_pathname._M_dataplus._M_p._0_4_ = *piVar10;
          if ((int)local_614[0].super_path._M_pathname._M_dataplus._M_p == local_62c) {
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff638,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff630);
          }
        }
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>,_false,_true>
                      *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      }
      bVar4 = std::optional::operator_cast_to_bool
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      if ((bVar4) &&
         (bVar4 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),
                                      Trace), bVar4)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                   (char *)in_stack_fffffffffffff640);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                   (char *)in_stack_fffffffffffff640);
        in_stack_fffffffffffff638 =
             (CCoinsViewCache *)
             std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff638);
        in_stack_fffffffffffff640 = local_614;
        in_stack_fffffffffffff630 = "%s limited pruning to height %d\n";
        in_stack_fffffffffffff628 = 1;
        logging_function._M_str._0_7_ = in_stack_fffffffffffff6f8;
        logging_function._M_len = in_stack_fffffffffffff6f0;
        logging_function._M_str._7_1_ = in_stack_fffffffffffff6ff;
        source_file._M_str._0_7_ = in_stack_fffffffffffff6e8;
        source_file._M_len = (size_t)in_stack_fffffffffffff6e0;
        source_file._M_str._7_1_ = in_stack_fffffffffffff6ef;
        LogPrintFormatInternal<std::__cxx11::string,int>
                  (logging_function,source_file,(int)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),level,
                   (ConstevalFormatString<2U>)in_stack_fffffffffffff6d8.fmt,
                   in_stack_fffffffffffff7e0,in_stack_fffffffffffff7e8);
      }
      if ((int)local_614[0].super_path._M_pathname.field_2._0_4_ < 1) {
        in_stack_fffffffffffff7e0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_653;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                  (in_stack_fffffffffffff680,
                   (string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (string *)in_stack_fffffffffffff670,(LogFlags)in_stack_fffffffffffff668,
                   (bool)in_stack_fffffffffffff667);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        std::allocator<char>::~allocator(&local_654);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        std::allocator<char>::~allocator((allocator<char> *)local_653);
        ::node::BlockManager::FindFilesToPrune
                  ((BlockManager *)
                   CONCAT17(in_stack_fffffffffffff79f,
                            CONCAT16(in_stack_fffffffffffff79e,in_stack_fffffffffffff798)),
                   in_stack_fffffffffffff790,in_stack_fffffffffffff78c,in_stack_fffffffffffff780,
                   in_stack_fffffffffffff778);
        *(undefined1 *)(*(long *)(in_RDI + 0x48) + 0x58) = 0;
        BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
                  ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
                   in_stack_fffffffffffff630);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                  (in_stack_fffffffffffff680,
                   (string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (string *)in_stack_fffffffffffff670,(LogFlags)in_stack_fffffffffffff668,
                   (bool)in_stack_fffffffffffff667);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        std::allocator<char>::~allocator((allocator<char> *)(local_653 + 1));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        std::allocator<char>::~allocator(local_651);
        std::min<int>((int *)in_stack_fffffffffffff630,
                      (int *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        ::node::BlockManager::FindFilesToPruneManual
                  (in_stack_fffffffffffff6e0,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff6d8.fmt,
                   iVar12,(Chainstate *)
                          CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
                   in_stack_fffffffffffff6c0);
        BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
                  ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
                   in_stack_fffffffffffff630);
      }
      bVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      if ((!bVar4) && (bVar3 = true, (*(byte *)(*(long *)(in_RDI + 0x48) + 600) & 1) == 0)) {
        std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::operator->
                  ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        level = (Level)&local_655;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        kernel::BlockTreeDB::WriteFlag
                  ((BlockTreeDB *)
                   CONCAT17(in_stack_fffffffffffff65f,
                            CONCAT16(in_stack_fffffffffffff65e,
                                     CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)))
                   ,in_stack_fffffffffffff650,SUB41((uint)in_stack_fffffffffffff64c >> 0x18,0));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        std::allocator<char>::~allocator(&local_655);
        *(undefined1 *)(*(long *)(in_RDI + 0x48) + 600) = 1;
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    }
  }
  local_660 = std::chrono::_V2::steady_clock::now();
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  bVar4 = std::chrono::operator==
                    ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffff638,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffff630);
  if (bVar4) {
    *(undefined8 *)(in_RDI + 0xd8) = local_660;
  }
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  bVar4 = std::chrono::operator==
                    ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffff638,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffff630);
  if (bVar4) {
    *(undefined8 *)(in_RDI + 0xe0) = local_660;
  }
  local_853 = in_EDX == 1 && 1 < (int)CVar7;
  local_854 = false;
  if (in_EDX == 2) {
    local_678.__r =
         (rep)std::chrono::operator+
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)in_stack_fffffffffffff630,
                         (duration<long,_std::ratio<3600L,_1L>_> *)
                         CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    sVar5 = std::chrono::
            operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff630,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),
               (__unspec *)0x14899bf);
    local_854 = std::operator>(sVar5._M_value);
  }
  bVar4 = false;
  if (in_EDX == 2) {
    local_688.__r =
         (rep)std::chrono::operator+
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)in_stack_fffffffffffff630,
                         (duration<long,_std::ratio<3600L,_1L>_> *)
                         CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    sVar5 = std::chrono::
            operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff630,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),
               (__unspec *)0x1489a6c);
    bVar4 = std::operator>(sVar5._M_value);
  }
  bVar1 = true;
  if ((((in_EDX != 3) && (bVar1 = true, in_EDX != 2 || (int)CVar7 < 1)) &&
      (bVar1 = true, in_EDX != 1 || 1 >= (int)CVar7)) && (bVar1 = true, bVar4 == false)) {
    bVar1 = bVar3;
  }
  if ((bVar1) || (local_854 != false)) {
    bVar4 = CheckDiskSpace(in_stack_fffffffffffff640,(uint64_t)in_stack_fffffffffffff638);
    if (!bVar4) {
      ChainstateManager::GetNotifications
                ((ChainstateManager *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
      ;
      str.lit._4_4_ = in_stack_fffffffffffff67c;
      str.lit._0_4_ = in_stack_fffffffffffff678;
      ::_(str);
      local_6e1 = FatalError((Notifications *)in_stack_fffffffffffff638,
                             (BlockValidationState *)in_stack_fffffffffffff630,
                             (bilingual_str *)
                             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      bVar4 = true;
      goto LAB_0148a806;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
              (in_stack_fffffffffffff680,
               (string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (string *)in_stack_fffffffffffff670,(LogFlags)in_stack_fffffffffffff668,
               (bool)in_stack_fffffffffffff667);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    std::allocator<char>::~allocator(&local_68b);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    std::allocator<char>::~allocator(local_68a);
    CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    bVar4 = ::node::BlockManager::FlushChainstateBlockFile
                      ((BlockManager *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660)
                       ,CONCAT13(in_stack_fffffffffffff65f,
                                 CONCAT12(in_stack_fffffffffffff65e,in_stack_fffffffffffff65c)));
    if ((!bVar4) &&
       (bVar4 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),
                                    Trace), bVar4)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                 (char *)in_stack_fffffffffffff640);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                 (char *)in_stack_fffffffffffff640);
      in_stack_fffffffffffff638 = (CCoinsViewCache *)0x1d35d28;
      in_stack_fffffffffffff630 = "%s: Failed to flush block file.\n";
      in_stack_fffffffffffff628 = 3;
      logging_function_00._M_str._0_7_ = in_stack_fffffffffffff6f8;
      logging_function_00._M_len = in_stack_fffffffffffff6f0;
      logging_function_00._M_str._7_1_ = in_stack_fffffffffffff6ff;
      source_file_00._M_str._0_7_ = in_stack_fffffffffffff6e8;
      source_file_00._M_len = (size_t)in_stack_fffffffffffff6e0;
      source_file_00._M_str._7_1_ = in_stack_fffffffffffff6ef;
      LogPrintFormatInternal<char[17]>
                (logging_function_00,source_file_00,(int)((ulong)in_stack_fffffffffffff698 >> 0x20),
                 CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),level,
                 in_stack_fffffffffffff6d8,(char (*) [17])in_stack_fffffffffffff7e0);
    }
    BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
              ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
               in_stack_fffffffffffff630);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
              (in_stack_fffffffffffff680,
               (string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (string *)in_stack_fffffffffffff670,(LogFlags)in_stack_fffffffffffff668,
               (bool)in_stack_fffffffffffff667);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    std::allocator<char>::~allocator(&local_6b2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    std::allocator<char>::~allocator(local_6b1);
    bVar4 = ::node::BlockManager::WriteBlockIndexDB((BlockManager *)in_stack_fffffffffffff6c0);
    if (!bVar4) {
      ChainstateManager::GetNotifications
                ((ChainstateManager *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
      ;
      str_00.lit._4_4_ = in_stack_fffffffffffff67c;
      str_00.lit._0_4_ = in_stack_fffffffffffff678;
      ::_(str_00);
      local_6e1 = FatalError((Notifications *)in_stack_fffffffffffff638,
                             (BlockValidationState *)in_stack_fffffffffffff630,
                             (bilingual_str *)
                             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    }
    bVar4 = !bVar4;
    BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
              ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
               in_stack_fffffffffffff630);
    if (bVar4) goto LAB_0148a806;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                 (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                 (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (in_stack_fffffffffffff680,
                 (string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                 (string *)in_stack_fffffffffffff670,(LogFlags)in_stack_fffffffffffff668,
                 (bool)in_stack_fffffffffffff667);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      std::allocator<char>::~allocator(&local_6b4);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      std::allocator<char>::~allocator(&local_6b3);
      ::node::BlockManager::UnlinkPrunedFiles
                (in_stack_fffffffffffff670,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff668);
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
                ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
                 in_stack_fffffffffffff630);
    }
    *(undefined8 *)(in_RDI + 0xd8) = local_660;
  }
  bVar13 = 0;
  if (bVar1) {
    pCVar11 = CoinsTip((Chainstate *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
    (*(pCVar11->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(local_440);
    bVar3 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffff638);
    bVar13 = bVar3 ^ 0xff;
  }
  if ((bVar13 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (char *)in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    tinyformat::format<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffff668,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               (unsigned_long *)
               CONCAT17(in_stack_fffffffffffff65f,
                        CONCAT16(in_stack_fffffffffffff65e,
                                 CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658))));
    BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
              (in_stack_fffffffffffff680,
               (string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (string *)in_stack_fffffffffffff670,(LogFlags)in_stack_fffffffffffff668,
               (bool)in_stack_fffffffffffff667);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    std::allocator<char>::~allocator(&local_6b5);
    CoinsTip((Chainstate *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
    CCoinsViewCache::GetCacheSize
              ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    bVar3 = CheckDiskSpace(in_stack_fffffffffffff640,(uint64_t)in_stack_fffffffffffff638);
    if (bVar3) {
      bVar3 = true;
      if ((in_EDX != 3) && (bVar3 = true, in_EDX != 2 || (int)CVar7 < 1)) {
        bVar3 = local_853;
      }
      if (bVar3) {
        in_stack_fffffffffffff6a8 =
             CoinsTip((Chainstate *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        bVar3 = CCoinsViewCache::Flush(in_stack_fffffffffffff638);
        in_stack_fffffffffffff6a4 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff6a4);
        if (bVar3) {
LAB_0148a7a3:
          *(undefined8 *)(in_RDI + 0xe0) = local_660;
          bVar2 = true;
          bVar4 = false;
          goto LAB_0148a7cd;
        }
      }
      else {
        in_stack_fffffffffffff698 =
             CoinsTip((Chainstate *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        bVar3 = CCoinsViewCache::Sync
                          ((CCoinsViewCache *)
                           CONCAT17(in_stack_fffffffffffff65f,
                                    CONCAT16(in_stack_fffffffffffff65e,
                                             CONCAT24(in_stack_fffffffffffff65c,
                                                      in_stack_fffffffffffff658))));
        if (bVar3) goto LAB_0148a7a3;
      }
      ChainstateManager::GetNotifications
                ((ChainstateManager *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
      ;
      str_02.lit._4_4_ = in_stack_fffffffffffff67c;
      str_02.lit._0_4_ = in_stack_fffffffffffff678;
      ::_(str_02);
      local_6e1 = FatalError((Notifications *)in_stack_fffffffffffff638,
                             (BlockValidationState *)in_stack_fffffffffffff630,
                             (bilingual_str *)
                             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      bVar4 = true;
    }
    else {
      ChainstateManager::GetNotifications
                ((ChainstateManager *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
      ;
      str_01.lit._4_4_ = in_stack_fffffffffffff67c;
      str_01.lit._0_4_ = in_stack_fffffffffffff678;
      ::_(str_01);
      local_6e1 = FatalError((Notifications *)in_stack_fffffffffffff638,
                             (BlockValidationState *)in_stack_fffffffffffff630,
                             (bilingual_str *)
                             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      bVar4 = true;
    }
LAB_0148a7cd:
    BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
              ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
               in_stack_fffffffffffff630);
    if (bVar4) goto LAB_0148a806;
  }
  bVar4 = false;
LAB_0148a806:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  if (!bVar4) {
    if ((bVar2) && (*(long *)(*(long *)(in_RDI + 0x50) + 0x7d8) != 0)) {
      GetRole((Chainstate *)in_stack_fffffffffffff638);
      CChain::GetLocator((CChain *)in_stack_fffffffffffff630);
      ValidationSignals::ChainStateFlushed
                ((ValidationSignals *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a4,
                 (CBlockLocator *)in_stack_fffffffffffff698);
      CBlockLocator::~CBlockLocator
                ((CBlockLocator *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    }
    local_6e1 = 1;
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_6e1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::FlushStateToDisk(
    BlockValidationState &state,
    FlushStateMode mode,
    int nManualPruneHeight)
{
    LOCK(cs_main);
    assert(this->CanFlushToDisk());
    std::set<int> setFilesToPrune;
    bool full_flush_completed = false;

    const size_t coins_count = CoinsTip().GetCacheSize();
    const size_t coins_mem_usage = CoinsTip().DynamicMemoryUsage();

    try {
    {
        bool fFlushForPrune = false;
        bool fDoFullFlush = false;

        CoinsCacheSizeState cache_state = GetCoinsCacheSizeState();
        LOCK(m_blockman.cs_LastBlockFile);
        if (m_blockman.IsPruneMode() && (m_blockman.m_check_for_pruning || nManualPruneHeight > 0) && m_chainman.m_blockman.m_blockfiles_indexed) {
            // make sure we don't prune above any of the prune locks bestblocks
            // pruning is height-based
            int last_prune{m_chain.Height()}; // last height we can prune
            std::optional<std::string> limiting_lock; // prune lock that actually was the limiting factor, only used for logging

            for (const auto& prune_lock : m_blockman.m_prune_locks) {
                if (prune_lock.second.height_first == std::numeric_limits<int>::max()) continue;
                // Remove the buffer and one additional block here to get actual height that is outside of the buffer
                const int lock_height{prune_lock.second.height_first - PRUNE_LOCK_BUFFER - 1};
                last_prune = std::max(1, std::min(last_prune, lock_height));
                if (last_prune == lock_height) {
                    limiting_lock = prune_lock.first;
                }
            }

            if (limiting_lock) {
                LogDebug(BCLog::PRUNE, "%s limited pruning to height %d\n", limiting_lock.value(), last_prune);
            }

            if (nManualPruneHeight > 0) {
                LOG_TIME_MILLIS_WITH_CATEGORY("find files to prune (manual)", BCLog::BENCH);

                m_blockman.FindFilesToPruneManual(
                    setFilesToPrune,
                    std::min(last_prune, nManualPruneHeight),
                    *this, m_chainman);
            } else {
                LOG_TIME_MILLIS_WITH_CATEGORY("find files to prune", BCLog::BENCH);

                m_blockman.FindFilesToPrune(setFilesToPrune, last_prune, *this, m_chainman);
                m_blockman.m_check_for_pruning = false;
            }
            if (!setFilesToPrune.empty()) {
                fFlushForPrune = true;
                if (!m_blockman.m_have_pruned) {
                    m_blockman.m_block_tree_db->WriteFlag("prunedblockfiles", true);
                    m_blockman.m_have_pruned = true;
                }
            }
        }
        const auto nNow{SteadyClock::now()};
        // Avoid writing/flushing immediately after startup.
        if (m_last_write == decltype(m_last_write){}) {
            m_last_write = nNow;
        }
        if (m_last_flush == decltype(m_last_flush){}) {
            m_last_flush = nNow;
        }
        // The cache is large and we're within 10% and 10 MiB of the limit, but we have time now (not in the middle of a block processing).
        bool fCacheLarge = mode == FlushStateMode::PERIODIC && cache_state >= CoinsCacheSizeState::LARGE;
        // The cache is over the limit, we have to write now.
        bool fCacheCritical = mode == FlushStateMode::IF_NEEDED && cache_state >= CoinsCacheSizeState::CRITICAL;
        // It's been a while since we wrote the block index to disk. Do this frequently, so we don't need to redownload after a crash.
        bool fPeriodicWrite = mode == FlushStateMode::PERIODIC && nNow > m_last_write + DATABASE_WRITE_INTERVAL;
        // It's been very long since we flushed the cache. Do this infrequently, to optimize cache usage.
        bool fPeriodicFlush = mode == FlushStateMode::PERIODIC && nNow > m_last_flush + DATABASE_FLUSH_INTERVAL;
        // Combine all conditions that result in a full cache flush.
        fDoFullFlush = (mode == FlushStateMode::ALWAYS) || fCacheLarge || fCacheCritical || fPeriodicFlush || fFlushForPrune;
        // Write blocks and block index to disk.
        if (fDoFullFlush || fPeriodicWrite) {
            // Ensure we can write block index
            if (!CheckDiskSpace(m_blockman.m_opts.blocks_dir)) {
                return FatalError(m_chainman.GetNotifications(), state, _("Disk space is too low!"));
            }
            {
                LOG_TIME_MILLIS_WITH_CATEGORY("write block and undo data to disk", BCLog::BENCH);

                // First make sure all block and undo data is flushed to disk.
                // TODO: Handle return error, or add detailed comment why it is
                // safe to not return an error upon failure.
                if (!m_blockman.FlushChainstateBlockFile(m_chain.Height())) {
                    LogPrintLevel(BCLog::VALIDATION, BCLog::Level::Warning, "%s: Failed to flush block file.\n", __func__);
                }
            }

            // Then update all block file information (which may refer to block and undo files).
            {
                LOG_TIME_MILLIS_WITH_CATEGORY("write block index to disk", BCLog::BENCH);

                if (!m_blockman.WriteBlockIndexDB()) {
                    return FatalError(m_chainman.GetNotifications(), state, _("Failed to write to block index database."));
                }
            }
            // Finally remove any pruned files
            if (fFlushForPrune) {
                LOG_TIME_MILLIS_WITH_CATEGORY("unlink pruned files", BCLog::BENCH);

                m_blockman.UnlinkPrunedFiles(setFilesToPrune);
            }
            m_last_write = nNow;
        }
        // Flush best chain related state. This can only be done if the blocks / block index write was also done.
        if (fDoFullFlush && !CoinsTip().GetBestBlock().IsNull()) {
            LOG_TIME_MILLIS_WITH_CATEGORY(strprintf("write coins cache to disk (%d coins, %.2fkB)",
                coins_count, coins_mem_usage / 1000), BCLog::BENCH);

            // Typical Coin structures on disk are around 48 bytes in size.
            // Pushing a new one to the database can cause it to be written
            // twice (once in the log, and once in the tables). This is already
            // an overestimation, as most will delete an existing entry or
            // overwrite one. Still, use a conservative safety factor of 2.
            if (!CheckDiskSpace(m_chainman.m_options.datadir, 48 * 2 * 2 * CoinsTip().GetCacheSize())) {
                return FatalError(m_chainman.GetNotifications(), state, _("Disk space is too low!"));
            }
            // Flush the chainstate (which may refer to block index entries).
            const auto empty_cache{(mode == FlushStateMode::ALWAYS) || fCacheLarge || fCacheCritical};
            if (empty_cache ? !CoinsTip().Flush() : !CoinsTip().Sync()) {
                return FatalError(m_chainman.GetNotifications(), state, _("Failed to write to coin database."));
            }
            m_last_flush = nNow;
            full_flush_completed = true;
            TRACE5(utxocache, flush,
                   int64_t{Ticks<std::chrono::microseconds>(SteadyClock::now() - nNow)},
                   (uint32_t)mode,
                   (uint64_t)coins_count,
                   (uint64_t)coins_mem_usage,
                   (bool)fFlushForPrune);
        }
    }
    if (full_flush_completed && m_chainman.m_options.signals) {
        // Update best block in wallet (so we can detect restored wallets).
        m_chainman.m_options.signals->ChainStateFlushed(this->GetRole(), m_chain.GetLocator());
    }
    } catch (const std::runtime_error& e) {
        return FatalError(m_chainman.GetNotifications(), state, strprintf(_("System error while flushing: %s"), e.what()));
    }
    return true;
}